

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t sysbvm_string_computeHashWithBytes(size_t size,uint8_t *bytes)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = 0x41c64e6d;
  if (size != 0) {
    sVar2 = 0;
    do {
      uVar1 = uVar1 * 0x41c64e6d + (ulong)bytes[sVar2] & 0x7ffffffffffffff;
      sVar2 = sVar2 + 1;
    } while (size != sVar2);
  }
  return uVar1;
}

Assistant:

SYSBVM_API size_t sysbvm_string_computeHashWithBytes(size_t size, const uint8_t *bytes)
{
    size_t result = sysbvm_hashMultiply(1);
    for(size_t i = 0; i < size; ++i)
        result = sysbvm_hashConcatenate(result, bytes[i]);
    return result;
}